

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetPropertyEquivalenceInfo
          (DictionaryTypeHandlerBase<unsigned_short> *this,PropertyRecord *propertyRecord,
          PropertyEquivalenceInfo *info)

{
  short sVar1;
  code *pcVar2;
  bool bVar3;
  unsigned_short uVar4;
  uint16 uVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined4 *puVar6;
  PropertyIndex local_3a;
  DictionaryPropertyDescriptor<unsigned_short> *pDStack_28;
  unsigned_short propertyIndex;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyEquivalenceInfo *info_local;
  PropertyRecord *propertyRecord_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)info;
  info_local = (PropertyEquivalenceInfo *)propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_00,(PropertyRecord **)&info_local,&stack0xffffffffffffffd8);
  if ((bVar3) && ((pDStack_28->Attributes & 8) == 0)) {
    uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDStack_28);
    if (uVar4 == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xeb,
                                  "(descriptor->template GetDataPropertyIndex<false>() != Constants::NoSlot)"
                                  ,"We don\'t support equivalent object type spec on accessors.");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDStack_28);
    if (uVar4 == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xec,
                                  "(descriptor->template GetDataPropertyIndex<false>() <= Constants::PropertyIndexMax)"
                                  ,
                                  "We don\'t support equivalent object type spec on big property indexes."
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDStack_28);
    if (uVar4 < 0xffff) {
      local_3a = DynamicTypeHandler::AdjustValidSlotIndexForInlineSlots
                           (&this->super_DynamicTypeHandler,uVar4);
    }
    else {
      local_3a = 0xffff;
    }
    descriptor->flags = (undefined1)local_3a;
    descriptor->Attributes = local_3a._1_1_;
    uVar5 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler);
    *(bool *)&descriptor->Data = uVar5 <= uVar4;
    *(bool *)((long)&descriptor->Data + 1) = (pDStack_28->Attributes & 4) != 0;
  }
  else {
    descriptor->flags = ~None;
    descriptor->Attributes = 0xff;
    *(undefined1 *)&descriptor->Data = 0;
    *(undefined1 *)((long)&descriptor->Data + 1) = 0;
  }
  sVar1._0_1_ = descriptor->flags;
  sVar1._1_1_ = descriptor->Attributes;
  return sVar1 != -1;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        if (this->propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            AssertMsg(descriptor->template GetDataPropertyIndex<false>() != Constants::NoSlot, "We don't support equivalent object type spec on accessors.");
            AssertMsg(descriptor->template GetDataPropertyIndex<false>() <= Constants::PropertyIndexMax, "We don't support equivalent object type spec on big property indexes.");
            T propertyIndex = descriptor->template GetDataPropertyIndex<false>();
            info.slotIndex = propertyIndex <= Constants::PropertyIndexMax ?
                AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(propertyIndex)) : Constants::NoSlot;
            info.isAuxSlot = propertyIndex >= GetInlineSlotCapacity();
            info.isWritable = !!(descriptor->Attributes & PropertyWritable);
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isAuxSlot = false;
            info.isWritable = false;
        }
        return info.slotIndex != Constants::NoSlot;
    }